

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::bson::
basic_bson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::read_string(basic_bson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
              *this,string_type *buffer,error_code *ec)

{
  binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *source;
  size_t *psVar1;
  uchar *puVar2;
  uchar *puVar3;
  uchar *puVar4;
  undefined8 in_RAX;
  type_conflict2 tVar5;
  ulong uVar6;
  bson_errc __e;
  ulong uVar7;
  long lVar8;
  size_t length;
  uint8_t c;
  uint8_t buf [4];
  uchar auStack_25 [5];
  
  source = &this->source_;
  puVar2 = (this->source_).current_._M_current;
  puVar3 = (this->source_).end_._M_current;
  uVar6 = 4;
  if ((ulong)((long)puVar3 - (long)puVar2) < 4) {
    uVar6 = (long)puVar3 - (long)puVar2;
  }
  if (puVar3 != puVar2) {
    uVar7 = 0;
    puVar4 = puVar2;
    do {
      (source->current_)._M_current = puVar4 + 1;
      auStack_25[uVar7 + 1] = *puVar4;
      uVar7 = uVar7 + 1;
      puVar4 = puVar4 + 1;
    } while (uVar6 != uVar7);
  }
  psVar1 = &(this->source_).position_;
  *psVar1 = *psVar1 + uVar6;
  psVar1 = &(this->state_stack_).
            super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
  *psVar1 = *psVar1 + uVar6;
  if (3 < (ulong)((long)puVar3 - (long)puVar2)) {
    lVar8 = (long)(int)((ulong)in_RAX >> 0x20);
    if (lVar8 < 1) {
      __e = string_length_is_non_positive;
      goto LAB_0024f2f1;
    }
    length = lVar8 - 1;
    tVar5 = source_reader<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::read<std::__cxx11::string>(source,buffer,length);
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + tVar5;
    if (tVar5 == length) {
      puVar2 = (this->source_).current_._M_current;
      puVar3 = (this->source_).end_._M_current;
      uVar6 = (ulong)(puVar3 != puVar2);
      if (puVar3 == puVar2) {
        psVar1 = &(this->source_).position_;
        *psVar1 = *psVar1 + uVar6;
        psVar1 = &(this->state_stack_).
                  super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
        *psVar1 = *psVar1 + uVar6;
      }
      else {
        uVar7 = 0;
        puVar4 = puVar2;
        do {
          (source->current_)._M_current = puVar4 + 1;
          auStack_25[uVar7] = *puVar4;
          uVar7 = uVar7 + 1;
          puVar4 = puVar4 + 1;
        } while (uVar6 != uVar7);
        psVar1 = &(this->source_).position_;
        *psVar1 = *psVar1 + uVar6;
        psVar1 = &(this->state_stack_).
                  super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
        *psVar1 = *psVar1 + uVar6;
        if (puVar3 != puVar2) {
          return;
        }
      }
    }
  }
  __e = unexpected_eof;
LAB_0024f2f1:
  std::error_code::operator=(ec,__e);
  this->more_ = false;
  return;
}

Assistant:

void read_string(string_type& buffer, std::error_code& ec)
    {
        uint8_t buf[sizeof(int32_t)]; 
        std::size_t n = source_.read(buf, sizeof(int32_t));
        state_stack_.back().pos += n;
        if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
        {
            ec = bson_errc::unexpected_eof;
            more_ = false;
            return;
        }
        auto len = binary::little_to_native<int32_t>(buf, sizeof(buf));
        if (JSONCONS_UNLIKELY(len < 1))
        {
            ec = bson_errc::string_length_is_non_positive;
            more_ = false;
            return;
        }

        std::size_t size = static_cast<std::size_t>(len) - static_cast<std::size_t>(1);
        n = source_reader<Source>::read(source_, buffer, size);
        state_stack_.back().pos += n;

        if (JSONCONS_UNLIKELY(n != size))
        {
            ec = bson_errc::unexpected_eof;
            more_ = false;
            return;
        }
        uint8_t c;
        n = source_.read(&c, 1);
        state_stack_.back().pos += n;
        if (JSONCONS_UNLIKELY(n != 1))
        {
            ec = bson_errc::unexpected_eof;
            more_ = false;
            return;
        }
    }